

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_label.c
# Opt level: O2

char * HTS_Label_get_string(HTS_Label *label,size_t index)

{
  size_t i;
  
  i = 0;
  do {
    label = (HTS_Label *)((HTS_LabelString *)label)->next;
    if (index <= i) break;
    i = i + 1;
  } while ((HTS_LabelString *)label != (HTS_LabelString *)0x0);
  if ((HTS_LabelString *)label != (HTS_LabelString *)0x0) {
    return ((HTS_LabelString *)label)->name;
  }
  return (char *)0x0;
}

Assistant:

const char *HTS_Label_get_string(HTS_Label * label, size_t index)
{
   size_t i;
   HTS_LabelString *lstring = label->head;

   for (i = 0; i < index && lstring; i++)
      lstring = lstring->next;
   if (!lstring)
      return NULL;
   return lstring->name;
}